

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CalcParser.h
# Opt level: O3

void __thiscall Calc::CalcParser::Evaluate(CalcParser *this,istream *stream)

{
  ParseTable *this_00;
  pointer pfVar1;
  bool bVar2;
  runtime_error *this_01;
  undefined1 local_1d8 [8];
  Parse<SGParser::ParseStackGenericElement> parser;
  DFATokenizer<SGParser::GenericToken> tokenizer;
  StdStreamAdapter input;
  
  tokenizer.ExpressionStack.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&PTR__InputStream_0010ec70;
  this_00 = (ParseTable *)((long)&parser.ErrorStackStr.field_2 + 8);
  SGParser::DFATokenizer<SGParser::GenericToken>::DFATokenizer
            ((DFATokenizer<SGParser::GenericToken> *)this_00,&this->automata,
             (InputStream *)
             &tokenizer.ExpressionStack.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  SGParser::Parse<SGParser::ParseStackGenericElement>::Parse
            ((Parse<SGParser::ParseStackGenericElement> *)local_1d8,(ParseTable *)0x0,0x800);
  bVar2 = SGParser::Parse<SGParser::ParseStackGenericElement>::Create
                    ((Parse<SGParser::ParseStackGenericElement> *)local_1d8,&this->table,0x800);
  if (bVar2) {
    parser.pParseTable = this_00;
    SGParser::Parse<SGParser::ParseStackGenericElement>::ResetParse
              ((Parse<SGParser::ParseStackGenericElement> *)local_1d8);
    pfVar1 = (this->numbers).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->numbers).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish != pfVar1) {
      (this->numbers).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish = pfVar1;
    }
    SGParser::Parse<SGParser::ParseStackGenericElement>::DoParse
              ((Parse<SGParser::ParseStackGenericElement> *)local_1d8,
               &this->super_ParseHandler<SGParser::ParseStackGenericElement>);
    SGParser::Parse<SGParser::ParseStackGenericElement>::~Parse
              ((Parse<SGParser::ParseStackGenericElement> *)local_1d8);
    parser.ErrorStackStr.field_2._8_8_ = &PTR__DFATokenizer_0010ecc8;
    if (tokenizer._104_8_ != 0) {
      operator_delete((void *)tokenizer._104_8_,
                      (long)tokenizer.ExpressionStack.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish - tokenizer._104_8_);
    }
    SGParser::TokenizerBase::FreeAllBuffers((TokenizerBase *)&tokenizer);
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,"failed to create parser");
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Evaluate(std::istream& stream) {
        StdStreamAdapter                input{stream};
        DFATokenizer<GenericToken>      tokenizer{&automata, &input};
        Parse<ParseStackGenericElement> parser;
        
        if (parser.Create(&table, &tokenizer) == false)
            throw std::runtime_error("failed to create parser");

        numbers.clear();

        parser.DoParse(*this);
    }